

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void doinsert(parse *p,sop op,sopno opnd,sopno pos)

{
  long lVar1;
  sop *psVar2;
  sop sVar3;
  long lVar4;
  
  if (p->error == 0) {
    lVar4 = p->slen;
    doemit(p,op,opnd);
    lVar1 = p->slen;
    if (lVar1 != lVar4 + 1) {
      __assert_fail("HERE() == sn+1",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x5f6,"void doinsert()");
    }
    if (pos < 1) {
      __assert_fail("pos > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x5fa,"void doinsert()");
    }
    psVar2 = p->strip;
    sVar3 = psVar2[lVar4];
    lVar4 = 0;
    do {
      if (pos <= p->pbegin[lVar4 + 1]) {
        p->pbegin[lVar4 + 1] = p->pbegin[lVar4 + 1] + 1;
      }
      if (pos <= p->pend[lVar4 + 1]) {
        p->pend[lVar4 + 1] = p->pend[lVar4 + 1] + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 9);
    memmove(psVar2 + pos + 1,psVar2 + pos,(lVar1 + ~pos) * 8);
    p->strip[pos] = sVar3;
  }
  return;
}

Assistant:

static void
doinsert(p, op, opnd, pos)
struct parse *p;
sop op;
sopno opnd;
sopno pos;
{
	sopno sn;
	sop s;
	int i;

	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	sn = HERE();
	EMIT(op, opnd);		/* do checks, ensure space */
	assert(HERE() == sn+1);
	s = p->strip[sn];

	/* adjust paren pointers */
	assert(pos > 0);
	for (i = 1; i < NPAREN; i++) {
		if (p->pbegin[i] >= pos) {
			p->pbegin[i]++;
		}
		if (p->pend[i] >= pos) {
			p->pend[i]++;
		}
	}

	memmove((char *)&p->strip[pos+1], (char *)&p->strip[pos],
				(size_t)(HERE()-pos-1)*sizeof(sop));
	p->strip[pos] = s;
}